

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::setLayoutQualifier
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType,TString *id,
          TIntermTyped *node)

{
  undefined1 *puVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  char *pcVar8;
  int *piVar9;
  char *pcVar10;
  _func_int *UNRECOVERED_JUMPTABLE;
  _func_int **pp_Var11;
  ulong uVar12;
  size_type sVar13;
  char *exts [2];
  pool_allocator<char> local_60;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  long lVar7;
  
  integerCheck(this,node,"layout-id value");
  iVar5 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x11])(node);
  lVar7 = CONCAT44(extraout_var,iVar5);
  if (lVar7 == 0) {
    uVar12 = 0;
  }
  else {
    uVar12 = (ulong)**(uint **)(*(long *)(lVar7 + 0xc0) + 8);
    if (*(char *)(lVar7 + 200) == '\0') {
      TParseVersions::requireProfile((TParseVersions *)this,loc,6,"non-literal layout-id value");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,6,0x1b8,"GL_ARB_enhanced_layouts",
                 "non-literal layout-id value");
    }
  }
  uVar6 = (uint)uVar12;
  if ((int)uVar6 < 0) {
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar10 = "cannot be negative";
    pcVar8 = "layout-id value";
    goto LAB_0043219f;
  }
  sVar2 = id->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (id->_M_dataplus)._M_p;
    sVar13 = 0;
    do {
      iVar5 = tolower((int)pcVar3[sVar13]);
      pcVar3[sVar13] = (char)iVar5;
      sVar13 = sVar13 + 1;
    } while (sVar2 != sVar13);
  }
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"offset");
  if (iVar5 == 0) {
    if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv == 0) {
      TParseVersions::requireProfile((TParseVersions *)this,loc,0xe,"offset");
      local_58._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)0x7015e4;
      local_58._M_dataplus._M_p = "GL_ARB_shader_atomic_counters";
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,6,0x1a4,2,(char **)&local_58,"offset");
      TParseVersions::profileRequires((TParseVersions *)this,loc,8,0x136,(char *)0x0,"offset");
    }
    puVar1 = &(publicType->qualifier).field_0xc;
    *puVar1 = *puVar1 | 4;
    (publicType->qualifier).layoutOffset = uVar6;
    if (lVar7 != 0) {
      return;
    }
    pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar8 = "offset";
    goto LAB_004323f7;
  }
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"align");
  if (iVar5 == 0) {
    if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv == 0) {
      TParseVersions::requireProfile((TParseVersions *)this,loc,6,"uniform buffer-member align");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,6,0x1b8,"GL_ARB_enhanced_layouts",
                 "uniform buffer-member align");
    }
    if ((uVar6 == 0) || ((uVar6 + 0x7fffffff & uVar6) != 0)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"must be a power of 2","align","");
    }
    else {
      (publicType->qualifier).layoutAlign = uVar6;
    }
    if (lVar7 != 0) {
      return;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar10 = "needs a literal integer";
    pcVar8 = "align";
    goto LAB_0043219f;
  }
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"location");
  if (iVar5 == 0) {
    TParseVersions::profileRequires((TParseVersions *)this,loc,8,300,(char *)0x0,"location");
    local_58._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)0x701594;
    local_58._M_dataplus._M_p = "GL_ARB_explicit_attrib_location";
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x14a,2,(char **)&local_58,"location");
    if (uVar6 < 0xfff) {
      *(ulong *)&(publicType->qualifier).field_0x1c =
           *(ulong *)&(publicType->qualifier).field_0x1c & 0xfffffffffffff000 | uVar12;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"location is too large",(id->_M_dataplus)._M_p,"");
    }
    if (lVar7 != 0) {
      return;
    }
    pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar8 = "location";
    goto LAB_004323f7;
  }
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"set");
  if (iVar5 == 0) {
    if (uVar6 < 0x3f) {
      *(ulong *)&(publicType->qualifier).field_0x1c =
           *(ulong *)&(publicType->qualifier).field_0x1c & 0xffffffffffc07fff |
           (ulong)(uVar6 << 0xf);
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"set is too large",(id->_M_dataplus)._M_p,"");
    }
    if (uVar6 != 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
                (this,loc,"descriptor set");
    }
    if (lVar7 != 0) {
      return;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar10 = "needs a literal integer";
    pcVar8 = "set";
    goto LAB_0043219f;
  }
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"binding");
  if (iVar5 == 0) {
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0x1a4,"GL_ARB_shading_language_420pack","binding");
    TParseVersions::profileRequires((TParseVersions *)this,loc,8,0x136,(char *)0x0,"binding");
    if (uVar6 < 0xffff) {
      *(ulong *)&(publicType->qualifier).field_0x1c =
           *(ulong *)&(publicType->qualifier).field_0x1c & 0xffff0000ffffffff | uVar12 << 0x20;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"binding is too large",(id->_M_dataplus)._M_p,"");
    }
    if (lVar7 != 0) {
      return;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar10 = "needs a literal integer";
    pcVar8 = "binding";
    goto LAB_0043219f;
  }
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"constant_id");
  if (iVar5 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2b])
              (this,loc,"constant_id");
    if ((int)uVar6 < 0x7ff) {
      *(ulong *)&(publicType->qualifier).field_0x24 =
           *(ulong *)&(publicType->qualifier).field_0x24 & 0xfff800ffffffffff |
           (ulong)(uVar6 & 0x7ff) << 0x28;
      puVar1 = &(publicType->qualifier).field_0xc;
      *puVar1 = *puVar1 | 1;
      bVar4 = TIntermediate::addUsedConstantId
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,uVar6);
      if (!bVar4) {
        pcVar8 = "specialization-constant id already used";
        goto LAB_00432601;
      }
    }
    else {
      pcVar8 = "specialization-constant id is too large";
LAB_00432601:
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,pcVar8,(id->_M_dataplus)._M_p,"");
    }
    if (lVar7 != 0) {
      return;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar10 = "needs a literal integer";
    pcVar8 = "constant_id";
    goto LAB_0043219f;
  }
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"component");
  if (iVar5 == 0) {
    TParseVersions::requireProfile((TParseVersions *)this,loc,6,"component");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,6,0x1b8,"GL_ARB_enhanced_layouts","component");
    if (uVar6 < 4) {
      *(ulong *)&(publicType->qualifier).field_0x1c =
           *(ulong *)&(publicType->qualifier).field_0x1c & 0xffffffffffff8fff |
           (ulong)(uVar6 << 0xc);
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"component is too large",(id->_M_dataplus)._M_p,"");
    }
    if (lVar7 != 0) {
      return;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar10 = "needs a literal integer";
    pcVar8 = "component";
    goto LAB_0043219f;
  }
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,0,4,"xfb_");
  if (iVar5 == 0) {
    ((this->super_TParseContextBase).super_TParseVersions.intermediate)->xfbMode = true;
    TParseVersions::requireStage
              ((TParseVersions *)this,loc,
               EShLangGeometryMask|EShLangTessEvaluationMask|EShLangTessControlMask|
               EShLangVertexMask,"transform feedback qualifier");
    TParseVersions::requireProfile((TParseVersions *)this,loc,6,"transform feedback qualifier");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,6,0x1b8,"GL_ARB_enhanced_layouts",
               "transform feedback qualifier");
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"xfb_buffer");
    if (iVar5 == 0) {
      if ((this->resources).maxTransformFeedbackBuffers <= (int)uVar6) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"buffer is too large:",(id->_M_dataplus)._M_p,
                   "gl_MaxTransformFeedbackBuffers is %d");
      }
      if ((int)uVar6 < 0xf) {
        *(ulong *)&(publicType->qualifier).field_0x24 =
             *(ulong *)&(publicType->qualifier).field_0x24 & 0xfffffffffffffff0 |
             (ulong)(uVar6 & 0xf);
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"buffer is too large:",(id->_M_dataplus)._M_p,"internal max is %d",0xe);
      }
      if (lVar7 != 0) {
        return;
      }
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar10 = "needs a literal integer";
      pcVar8 = "xfb_buffer";
      goto LAB_0043219f;
    }
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"xfb_offset");
    if (iVar5 == 0) {
      if ((int)uVar6 < 0x1fff) {
        *(ulong *)&(publicType->qualifier).field_0x24 =
             *(ulong *)&(publicType->qualifier).field_0x24 & 0xffffffff8003ffff |
             (ulong)((uVar6 & 0x1fff) << 0x12);
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"offset is too large:",(id->_M_dataplus)._M_p,"internal max is %d",
                   0x1ffe);
      }
      if (lVar7 != 0) {
        return;
      }
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar10 = "needs a literal integer";
      pcVar8 = "xfb_offset";
      goto LAB_0043219f;
    }
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"xfb_stride");
    if (iVar5 == 0) {
      if ((this->resources).maxTransformFeedbackInterleavedComponents * 4 < (int)uVar6) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"1/4 stride is too large:",(id->_M_dataplus)._M_p,
                   "gl_MaxTransformFeedbackInterleavedComponents is %d");
      }
      if ((int)uVar6 < 0x3fff) {
        *(ulong *)&(publicType->qualifier).field_0x24 =
             *(ulong *)&(publicType->qualifier).field_0x24 & 0xfffffffffffc000f |
             (ulong)((uVar6 & 0x3fff) << 4);
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"stride is too large:",(id->_M_dataplus)._M_p,"internal max is %d",
                   0x3ffe);
      }
      if (lVar7 != 0) {
        return;
      }
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar10 = "needs a literal integer";
      pcVar8 = "xfb_stride";
      goto LAB_0043219f;
    }
  }
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"input_attachment_index");
  if (iVar5 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
              (this,loc,"input_attachment_index");
    if ((int)uVar6 < 0xff) {
      (publicType->qualifier).field_0x28 = (char)uVar12;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"attachment index is too large",(id->_M_dataplus)._M_p,"");
    }
    if (lVar7 != 0) {
      return;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar10 = "needs a literal integer";
    pcVar8 = "input_attachment_index";
    goto LAB_0043219f;
  }
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"num_views");
  if (iVar5 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,2,OVR_multiview_EXTs,"num_views");
    (publicType->shaderQualifiers).numViews = uVar6;
    if (lVar7 != 0) {
      return;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar10 = "needs a literal integer";
    pcVar8 = "num_views";
    goto LAB_0043219f;
  }
  if (((this->super_TParseContextBase).super_TParseVersions.language < EShLangFragment) &&
     (iVar5 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"secondary_view_offset"), iVar5 == 0)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_NV_stereo_view_rendering,"stereo view rendering");
    (publicType->qualifier).layoutSecondaryViewportRelativeOffset = uVar6;
    if (lVar7 != 0) {
      return;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar10 = "needs a literal integer";
    pcVar8 = "secondary_view_offset";
    goto LAB_0043219f;
  }
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"buffer_reference_align");
  if (iVar5 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_EXT_buffer_reference,"buffer_reference_align");
    if ((uVar6 == 0) || ((uVar6 + 0x7fffffff & uVar6) != 0)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"must be a power of 2","buffer_reference_align","");
    }
    else {
      uVar6 = IntLog2<int>(uVar6);
      *(ulong *)&(publicType->qualifier).field_0x24 =
           *(ulong *)&(publicType->qualifier).field_0x24 & 0xfe07ffffffffffff |
           (ulong)(uVar6 & 0x3f) << 0x33;
    }
    if (lVar7 != 0) {
      return;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar10 = "needs a literal integer";
    pcVar8 = "buffer_reference_align";
    goto LAB_0043219f;
  }
  switch((this->super_TParseContextBase).super_TParseVersions.language) {
  case EShLangTessControl:
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"vertices");
    if (iVar5 == 0) {
      if (uVar6 == 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"must be greater than 0","vertices","");
      }
      else {
        (publicType->shaderQualifiers).vertices = uVar6;
      }
      if (lVar7 != 0) {
        return;
      }
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar10 = "needs a literal integer";
      pcVar8 = "vertices";
      goto LAB_0043219f;
    }
    break;
  case EShLangGeometry:
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"invocations");
    if (iVar5 == 0) {
      TParseVersions::profileRequires((TParseVersions *)this,loc,6,400,(char *)0x0,"invocations");
      if (uVar6 == 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"must be at least 1","invocations","");
      }
      else {
        (publicType->shaderQualifiers).invocations = uVar6;
      }
      if (lVar7 != 0) {
        return;
      }
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar10 = "needs a literal integer";
      pcVar8 = "invocations";
      goto LAB_0043219f;
    }
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"max_vertices");
    if (iVar5 == 0) {
      (publicType->shaderQualifiers).vertices = uVar6;
      if ((this->resources).maxGeometryOutputVertices < (int)uVar6) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"too large, must be less than gl_MaxGeometryOutputVertices",
                   "max_vertices","");
      }
      if (lVar7 != 0) {
        return;
      }
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar10 = "needs a literal integer";
      pcVar8 = "max_vertices";
      goto LAB_0043219f;
    }
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"stream");
    if (iVar5 == 0) {
      TParseVersions::requireProfile((TParseVersions *)this,loc,-9,"selecting output stream");
      (publicType->qualifier).field_0x23 = (char)uVar12;
      if (uVar6 != 0) {
        ((this->super_TParseContextBase).super_TParseVersions.intermediate)->multiStream = true;
      }
      if (lVar7 != 0) {
        return;
      }
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar10 = "needs a literal integer";
      pcVar8 = "stream";
      goto LAB_0043219f;
    }
    break;
  case EShLangFragment:
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"index");
    if (iVar5 == 0) {
      TParseVersions::requireProfile
                ((TParseVersions *)this,loc,0xe,"index layout qualifier on fragment output");
      local_58._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)0x701594;
      local_58._M_dataplus._M_p = "GL_ARB_explicit_attrib_location";
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,6,0x14a,2,(char **)&local_58,
                 "index layout qualifier on fragment output");
      TParseVersions::profileRequires
                ((TParseVersions *)this,loc,8,0x136,"GL_EXT_blend_func_extended",
                 "index layout qualifier on fragment output");
      if (1 < (int)uVar6) {
        uVar12 = 0;
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"value must be 0 or 1","index","");
      }
      (publicType->qualifier).field_0x22 = (char)uVar12;
      if (lVar7 != 0) {
        return;
      }
      pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar8 = "index";
      goto LAB_004323f7;
    }
    break;
  case EShLangCompute:
  case EShLangTask:
    goto switchD_00432133_caseD_5;
  case EShLangMesh:
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"max_vertices");
    if (iVar5 == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,2,AEP_mesh_shader,"max_vertices");
      (publicType->shaderQualifiers).vertices = uVar6;
      iVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                        (this,"GL_EXT_mesh_shader");
      piVar9 = &(this->resources).maxMeshOutputVerticesNV;
      if ((char)iVar5 != '\0') {
        piVar9 = &(this->resources).maxMeshOutputVerticesEXT;
      }
      if (*piVar9 < (int)uVar6) {
        local_60.allocator = GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_58,"too large, must be less than ",&local_60);
        iVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_EXT_mesh_shader");
        pcVar8 = "gl_MaxMeshOutputVerticesNV";
        if ((char)iVar5 != '\0') {
          pcVar8 = "gl_MaxMeshOutputVerticesEXT";
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&local_58,pcVar8);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,local_58._M_dataplus._M_p,"max_vertices","");
      }
      if (lVar7 != 0) {
        return;
      }
      pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar8 = "max_vertices";
LAB_004323f7:
      (*pp_Var11[0x2d])(this,loc,"needs a literal integer",pcVar8,"");
      return;
    }
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"max_primitives");
    if (iVar5 == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,loc,2,AEP_mesh_shader,"max_primitives");
      (publicType->shaderQualifiers).primitives = uVar6;
      iVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                        (this,"GL_EXT_mesh_shader");
      piVar9 = &(this->resources).maxMeshOutputPrimitivesNV;
      if ((char)iVar5 != '\0') {
        piVar9 = &(this->resources).maxMeshOutputPrimitivesEXT;
      }
      if (*piVar9 < (int)uVar6) {
        local_60.allocator = GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_58,"too large, must be less than ",&local_60);
        iVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_EXT_mesh_shader");
        pcVar8 = "gl_MaxMeshOutputPrimitivesNV";
        if ((char)iVar5 != '\0') {
          pcVar8 = "gl_MaxMeshOutputPrimitivesEXT";
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&local_58,pcVar8);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,local_58._M_dataplus._M_p,"max_primitives","");
      }
      if (lVar7 != 0) {
        return;
      }
      pp_Var11 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar8 = "max_primitives";
      goto LAB_004323f7;
    }
switchD_00432133_caseD_5:
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,0,0xb,"local_size_");
    if (iVar5 == 0) {
      if (((this->super_TParseContextBase).super_TParseVersions.language & ~EShLangTessControl) ==
          EShLangTask) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                  (this,loc,2,AEP_mesh_shader,"gl_WorkGroupSize");
      }
      else {
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,8,0x136,(char *)0x0,"gl_WorkGroupSize");
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,-9,0x1ae,"GL_ARB_compute_shader","gl_WorkGroupSize");
      }
      if (lVar7 == 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"needs a literal integer","local_size","");
      }
      if ((uVar6 == 0) && (id->_M_string_length == 0xc)) {
        pcVar8 = (id->_M_dataplus)._M_p;
        UNRECOVERED_JUMPTABLE =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        pcVar10 = "must be at least 1";
        goto LAB_0043219f;
      }
      iVar5 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"local_size_x");
      if (iVar5 == 0) {
        (publicType->shaderQualifiers).localSize[0] = uVar6;
        (publicType->shaderQualifiers).localSizeNotDefault[0] = true;
        return;
      }
      iVar5 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"local_size_y");
      if (iVar5 == 0) {
        (publicType->shaderQualifiers).localSize[1] = uVar6;
        (publicType->shaderQualifiers).localSizeNotDefault[1] = true;
        return;
      }
      iVar5 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"local_size_z");
      if (iVar5 == 0) {
        (publicType->shaderQualifiers).localSize[2] = uVar6;
        (publicType->shaderQualifiers).localSizeNotDefault[2] = true;
        return;
      }
      if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv != 0) {
        iVar5 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (id,"local_size_x_id");
        if (iVar5 == 0) {
          (publicType->shaderQualifiers).localSizeSpecId[0] = uVar6;
          return;
        }
        iVar5 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (id,"local_size_y_id");
        if (iVar5 == 0) {
          (publicType->shaderQualifiers).localSizeSpecId[1] = uVar6;
          return;
        }
        iVar5 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (id,"local_size_z_id");
        if (iVar5 == 0) {
          (publicType->shaderQualifiers).localSizeSpecId[2] = uVar6;
          return;
        }
      }
    }
  }
  pcVar8 = (id->_M_dataplus)._M_p;
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  pcVar10 = "there is no such layout identifier for this stage taking an assigned value";
LAB_0043219f:
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar10,pcVar8,"",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::setLayoutQualifier(const TSourceLoc& loc, TPublicType& publicType, TString& id, const TIntermTyped* node)
{
    const char* feature = "layout-id value";
    const char* nonLiteralFeature = "non-literal layout-id value";

    integerCheck(node, feature);
    const TIntermConstantUnion* constUnion = node->getAsConstantUnion();
    int value;
    bool nonLiteral = false;
    if (constUnion) {
        value = constUnion->getConstArray()[0].getIConst();
        if (! constUnion->isLiteral()) {
            requireProfile(loc, ECoreProfile | ECompatibilityProfile, nonLiteralFeature);
            profileRequires(loc, ECoreProfile | ECompatibilityProfile, 440, E_GL_ARB_enhanced_layouts, nonLiteralFeature);
        }
    } else {
        // grammar should have give out the error message
        value = 0;
        nonLiteral = true;
    }

    if (value < 0) {
        error(loc, "cannot be negative", feature, "");
        return;
    }

    std::transform(id.begin(), id.end(), id.begin(), ::tolower);

    if (id == "offset") {
        // "offset" can be for either
        //  - uniform offsets
        //  - atomic_uint offsets
        const char* feature = "offset";
        if (spvVersion.spv == 0) {
            requireProfile(loc, EEsProfile | ECoreProfile | ECompatibilityProfile, feature);
            const char* exts[2] = { E_GL_ARB_enhanced_layouts, E_GL_ARB_shader_atomic_counters };
            profileRequires(loc, ECoreProfile | ECompatibilityProfile, 420, 2, exts, feature);
            profileRequires(loc, EEsProfile, 310, nullptr, feature);
        }
        publicType.qualifier.layoutOffset = value;
        publicType.qualifier.explicitOffset = true;
        if (nonLiteral)
            error(loc, "needs a literal integer", "offset", "");
        return;
    } else if (id == "align") {
        const char* feature = "uniform buffer-member align";
        if (spvVersion.spv == 0) {
            requireProfile(loc, ECoreProfile | ECompatibilityProfile, feature);
            profileRequires(loc, ECoreProfile | ECompatibilityProfile, 440, E_GL_ARB_enhanced_layouts, feature);
        }
        // "The specified alignment must be a power of 2, or a compile-time error results."
        if (! IsPow2(value))
            error(loc, "must be a power of 2", "align", "");
        else
            publicType.qualifier.layoutAlign = value;
        if (nonLiteral)
            error(loc, "needs a literal integer", "align", "");
        return;
    } else if (id == "location") {
        profileRequires(loc, EEsProfile, 300, nullptr, "location");
        const char* exts[2] = { E_GL_ARB_separate_shader_objects, E_GL_ARB_explicit_attrib_location };
        // GL_ARB_explicit_uniform_location requires 330 or GL_ARB_explicit_attrib_location we do not need to add it here
        profileRequires(loc, ~EEsProfile, 330, 2, exts, "location");
        if ((unsigned int)value >= TQualifier::layoutLocationEnd)
            error(loc, "location is too large", id.c_str(), "");
        else
            publicType.qualifier.layoutLocation = value;
        if (nonLiteral)
            error(loc, "needs a literal integer", "location", "");
        return;
    } else if (id == "set") {
        if ((unsigned int)value >= TQualifier::layoutSetEnd)
            error(loc, "set is too large", id.c_str(), "");
        else
            publicType.qualifier.layoutSet = value;
        if (value != 0)
            requireVulkan(loc, "descriptor set");
        if (nonLiteral)
            error(loc, "needs a literal integer", "set", "");
        return;
    } else if (id == "binding") {
        profileRequires(loc, ~EEsProfile, 420, E_GL_ARB_shading_language_420pack, "binding");
        profileRequires(loc, EEsProfile, 310, nullptr, "binding");
        if ((unsigned int)value >= TQualifier::layoutBindingEnd)
            error(loc, "binding is too large", id.c_str(), "");
        else
            publicType.qualifier.layoutBinding = value;
        if (nonLiteral)
            error(loc, "needs a literal integer", "binding", "");
        return;
    }
    if (id == "constant_id") {
        requireSpv(loc, "constant_id");
        if (value >= (int)TQualifier::layoutSpecConstantIdEnd) {
            error(loc, "specialization-constant id is too large", id.c_str(), "");
        } else {
            publicType.qualifier.layoutSpecConstantId = value;
            publicType.qualifier.specConstant = true;
            if (! intermediate.addUsedConstantId(value))
                error(loc, "specialization-constant id already used", id.c_str(), "");
        }
        if (nonLiteral)
            error(loc, "needs a literal integer", "constant_id", "");
        return;
    }
    if (id == "component") {
        requireProfile(loc, ECoreProfile | ECompatibilityProfile, "component");
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 440, E_GL_ARB_enhanced_layouts, "component");
        if ((unsigned)value >= TQualifier::layoutComponentEnd)
            error(loc, "component is too large", id.c_str(), "");
        else
            publicType.qualifier.layoutComponent = value;
        if (nonLiteral)
            error(loc, "needs a literal integer", "component", "");
        return;
    }
    if (id.compare(0, 4, "xfb_") == 0) {
        // "Any shader making any static use (after preprocessing) of any of these
        // *xfb_* qualifiers will cause the shader to be in a transform feedback
        // capturing mode and hence responsible for describing the transform feedback
        // setup."
        intermediate.setXfbMode();
        const char* feature = "transform feedback qualifier";
        requireStage(loc, (EShLanguageMask)(EShLangVertexMask | EShLangGeometryMask | EShLangTessControlMask | EShLangTessEvaluationMask), feature);
        requireProfile(loc, ECoreProfile | ECompatibilityProfile, feature);
        profileRequires(loc, ECoreProfile | ECompatibilityProfile, 440, E_GL_ARB_enhanced_layouts, feature);
        if (id == "xfb_buffer") {
            // "It is a compile-time error to specify an *xfb_buffer* that is greater than
            // the implementation-dependent constant gl_MaxTransformFeedbackBuffers."
            if (value >= resources.maxTransformFeedbackBuffers)
                error(loc, "buffer is too large:", id.c_str(), "gl_MaxTransformFeedbackBuffers is %d", resources.maxTransformFeedbackBuffers);
            if (value >= (int)TQualifier::layoutXfbBufferEnd)
                error(loc, "buffer is too large:", id.c_str(), "internal max is %d", TQualifier::layoutXfbBufferEnd-1);
            else
                publicType.qualifier.layoutXfbBuffer = value;
            if (nonLiteral)
                error(loc, "needs a literal integer", "xfb_buffer", "");
            return;
        } else if (id == "xfb_offset") {
            if (value >= (int)TQualifier::layoutXfbOffsetEnd)
                error(loc, "offset is too large:", id.c_str(), "internal max is %d", TQualifier::layoutXfbOffsetEnd-1);
            else
                publicType.qualifier.layoutXfbOffset = value;
            if (nonLiteral)
                error(loc, "needs a literal integer", "xfb_offset", "");
            return;
        } else if (id == "xfb_stride") {
            // "The resulting stride (implicit or explicit), when divided by 4, must be less than or equal to the
            // implementation-dependent constant gl_MaxTransformFeedbackInterleavedComponents."
            if (value > 4 * resources.maxTransformFeedbackInterleavedComponents) {
                error(loc, "1/4 stride is too large:", id.c_str(), "gl_MaxTransformFeedbackInterleavedComponents is %d",
                    resources.maxTransformFeedbackInterleavedComponents);
            }
            if (value >= (int)TQualifier::layoutXfbStrideEnd)
                error(loc, "stride is too large:", id.c_str(), "internal max is %d", TQualifier::layoutXfbStrideEnd-1);
            else
                publicType.qualifier.layoutXfbStride = value;
            if (nonLiteral)
                error(loc, "needs a literal integer", "xfb_stride", "");
            return;
        }
    }
    if (id == "input_attachment_index") {
        requireVulkan(loc, "input_attachment_index");
        if (value >= (int)TQualifier::layoutAttachmentEnd)
            error(loc, "attachment index is too large", id.c_str(), "");
        else
            publicType.qualifier.layoutAttachment = value;
        if (nonLiteral)
            error(loc, "needs a literal integer", "input_attachment_index", "");
        return;
    }
    if (id == "num_views") {
        requireExtensions(loc, Num_OVR_multiview_EXTs, OVR_multiview_EXTs, "num_views");
        publicType.shaderQualifiers.numViews = value;
        if (nonLiteral)
            error(loc, "needs a literal integer", "num_views", "");
        return;
    }
    if (language == EShLangVertex ||
        language == EShLangTessControl ||
        language == EShLangTessEvaluation ||
        language == EShLangGeometry) {
        if (id == "secondary_view_offset") {
            requireExtensions(loc, 1, &E_GL_NV_stereo_view_rendering, "stereo view rendering");
            publicType.qualifier.layoutSecondaryViewportRelativeOffset = value;
            if (nonLiteral)
                error(loc, "needs a literal integer", "secondary_view_offset", "");
            return;
        }
    }

    if (id == "buffer_reference_align") {
        requireExtensions(loc, 1, &E_GL_EXT_buffer_reference, "buffer_reference_align");
        if (! IsPow2(value))
            error(loc, "must be a power of 2", "buffer_reference_align", "");
        else
            publicType.qualifier.layoutBufferReferenceAlign = IntLog2(value);
        if (nonLiteral)
            error(loc, "needs a literal integer", "buffer_reference_align", "");
        return;
    }

    switch (language) {
    case EShLangTessControl:
        if (id == "vertices") {
            if (value == 0)
                error(loc, "must be greater than 0", "vertices", "");
            else
                publicType.shaderQualifiers.vertices = value;
            if (nonLiteral)
                error(loc, "needs a literal integer", "vertices", "");
            return;
        }
        break;

    case EShLangGeometry:
        if (id == "invocations") {
            profileRequires(loc, ECompatibilityProfile | ECoreProfile, 400, nullptr, "invocations");
            if (value == 0)
                error(loc, "must be at least 1", "invocations", "");
            else
                publicType.shaderQualifiers.invocations = value;
            if (nonLiteral)
                error(loc, "needs a literal integer", "invocations", "");
            return;
        }
        if (id == "max_vertices") {
            publicType.shaderQualifiers.vertices = value;
            if (value > resources.maxGeometryOutputVertices)
                error(loc, "too large, must be less than gl_MaxGeometryOutputVertices", "max_vertices", "");
            if (nonLiteral)
                error(loc, "needs a literal integer", "max_vertices", "");
            return;
        }
        if (id == "stream") {
            requireProfile(loc, ~EEsProfile, "selecting output stream");
            publicType.qualifier.layoutStream = value;
            if (value > 0)
                intermediate.setMultiStream();
            if (nonLiteral)
                error(loc, "needs a literal integer", "stream", "");
            return;
        }
        break;

    case EShLangFragment:
        if (id == "index") {
            requireProfile(loc, ECompatibilityProfile | ECoreProfile | EEsProfile, "index layout qualifier on fragment output");
            const char* exts[2] = { E_GL_ARB_separate_shader_objects, E_GL_ARB_explicit_attrib_location };
            profileRequires(loc, ECompatibilityProfile | ECoreProfile, 330, 2, exts, "index layout qualifier on fragment output");
            profileRequires(loc, EEsProfile ,310, E_GL_EXT_blend_func_extended, "index layout qualifier on fragment output");
            // "It is also a compile-time error if a fragment shader sets a layout index to less than 0 or greater than 1."
            if (value < 0 || value > 1) {
                value = 0;
                error(loc, "value must be 0 or 1", "index", "");
            }

            publicType.qualifier.layoutIndex = value;
            if (nonLiteral)
                error(loc, "needs a literal integer", "index", "");
            return;
        }
        break;

    case EShLangMesh:
        if (id == "max_vertices") {
            requireExtensions(loc, Num_AEP_mesh_shader, AEP_mesh_shader, "max_vertices");
            publicType.shaderQualifiers.vertices = value;
            int max = extensionTurnedOn(E_GL_EXT_mesh_shader) ? resources.maxMeshOutputVerticesEXT
                                                              : resources.maxMeshOutputVerticesNV;
            if (value > max) {
                TString maxsErrtring = "too large, must be less than ";
                maxsErrtring.append(extensionTurnedOn(E_GL_EXT_mesh_shader) ? "gl_MaxMeshOutputVerticesEXT"
                                                                            : "gl_MaxMeshOutputVerticesNV");
                error(loc, maxsErrtring.c_str(), "max_vertices", "");
            }
            if (nonLiteral)
                error(loc, "needs a literal integer", "max_vertices", "");
            return;
        }
        if (id == "max_primitives") {
            requireExtensions(loc, Num_AEP_mesh_shader, AEP_mesh_shader, "max_primitives");
            publicType.shaderQualifiers.primitives = value;
            int max = extensionTurnedOn(E_GL_EXT_mesh_shader) ? resources.maxMeshOutputPrimitivesEXT
                                                              : resources.maxMeshOutputPrimitivesNV;
            if (value > max) {
                TString maxsErrtring = "too large, must be less than ";
                maxsErrtring.append(extensionTurnedOn(E_GL_EXT_mesh_shader) ? "gl_MaxMeshOutputPrimitivesEXT"
                                                                            : "gl_MaxMeshOutputPrimitivesNV");
                error(loc, maxsErrtring.c_str(), "max_primitives", "");
            }
            if (nonLiteral)
                error(loc, "needs a literal integer", "max_primitives", "");
            return;
        }
        [[fallthrough]];

    case EShLangTask:
        // Fall through
    case EShLangCompute:
        if (id.compare(0, 11, "local_size_") == 0) {
            if (language == EShLangMesh || language == EShLangTask) {
                requireExtensions(loc, Num_AEP_mesh_shader, AEP_mesh_shader, "gl_WorkGroupSize");
            } else {
                profileRequires(loc, EEsProfile, 310, nullptr, "gl_WorkGroupSize");
                profileRequires(loc, ~EEsProfile, 430, E_GL_ARB_compute_shader, "gl_WorkGroupSize");
            }
            if (nonLiteral)
                error(loc, "needs a literal integer", "local_size", "");
            if (id.size() == 12 && value == 0) {
                error(loc, "must be at least 1", id.c_str(), "");
                return;
            }
            if (id == "local_size_x") {
                publicType.shaderQualifiers.localSize[0] = value;
                publicType.shaderQualifiers.localSizeNotDefault[0] = true;
                return;
            }
            if (id == "local_size_y") {
                publicType.shaderQualifiers.localSize[1] = value;
                publicType.shaderQualifiers.localSizeNotDefault[1] = true;
                return;
            }
            if (id == "local_size_z") {
                publicType.shaderQualifiers.localSize[2] = value;
                publicType.shaderQualifiers.localSizeNotDefault[2] = true;
                return;
            }
            if (spvVersion.spv != 0) {
                if (id == "local_size_x_id") {
                    publicType.shaderQualifiers.localSizeSpecId[0] = value;
                    return;
                }
                if (id == "local_size_y_id") {
                    publicType.shaderQualifiers.localSizeSpecId[1] = value;
                    return;
                }
                if (id == "local_size_z_id") {
                    publicType.shaderQualifiers.localSizeSpecId[2] = value;
                    return;
                }
            }
        }
        break;

    default:
        break;
    }

    error(loc, "there is no such layout identifier for this stage taking an assigned value", id.c_str(), "");
}